

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O2

void Assimp::Write(JSONWriter *out,aiTexture *ai,bool is_elem)

{
  aiTexel *paVar1;
  uint uVar2;
  size_t __n;
  uint x;
  uint uVar3;
  allocator<char> local_465;
  uint local_464;
  uint *local_460;
  void *local_458;
  ulong local_450;
  aiString local_438;
  
  JSONWriter::StartObj(out,is_elem);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"width",(allocator<char> *)&local_458);
  JSONWriter::Key(out,(string *)&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  JSONWriter::SimpleValue<unsigned_int>(out,&ai->mWidth);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"height",(allocator<char> *)&local_458);
  JSONWriter::Key(out,(string *)&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  local_460 = &ai->mHeight;
  JSONWriter::SimpleValue<unsigned_int>(out,local_460);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"formathint",(allocator<char> *)&local_458);
  JSONWriter::Key(out,(string *)&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,ai->achFormatHint,&local_465);
  __n = 0x3ff;
  if ((local_450 & 0xfffffc00) == 0) {
    __n = local_450 & 0xffffffff;
  }
  local_438.length = (ai_uint32)__n;
  memcpy(local_438.data,local_458,__n);
  local_438.data[__n] = '\0';
  JSONWriter::SimpleValue<aiString>(out,&local_438);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"data",(allocator<char> *)&local_458);
  JSONWriter::Key(out,(string *)&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  if (*local_460 == 0) {
    JSONWriter::SimpleValue(out,ai->pcData,(ulong)ai->mWidth);
  }
  else {
    JSONWriter::StartArray(out,false);
    uVar3 = 0;
    while (uVar3 < *local_460) {
      local_464 = uVar3;
      JSONWriter::StartArray(out,true);
      for (uVar3 = 0; uVar3 < ai->mWidth; uVar3 = uVar3 + 1) {
        paVar1 = ai->pcData;
        uVar2 = ai->mWidth * local_464 + uVar3;
        JSONWriter::StartArray(out,true);
        local_438.length = (ai_uint32)paVar1[uVar2].r;
        JSONWriter::Element<unsigned_int>(out,&local_438.length);
        local_438.length = (ai_uint32)paVar1[uVar2].g;
        JSONWriter::Element<unsigned_int>(out,&local_438.length);
        local_438.length = (ai_uint32)paVar1[uVar2].b;
        JSONWriter::Element<unsigned_int>(out,&local_438.length);
        local_438.length = (ai_uint32)paVar1[uVar2].a;
        JSONWriter::Element<unsigned_int>(out,&local_438.length);
        JSONWriter::EndArray(out);
      }
      JSONWriter::EndArray(out);
      uVar3 = local_464 + 1;
    }
    JSONWriter::EndArray(out);
  }
  JSONWriter::EndObj(out);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiTexture& ai, bool is_elem = true) {
    out.StartObj(is_elem);

    out.Key("width");
    out.SimpleValue(ai.mWidth);

    out.Key("height");
    out.SimpleValue(ai.mHeight);

    out.Key("formathint");
    out.SimpleValue(aiString(ai.achFormatHint));

    out.Key("data");
    if (!ai.mHeight) {
        out.SimpleValue(ai.pcData, ai.mWidth);
    }
    else {
        out.StartArray();
        for (unsigned int y = 0; y < ai.mHeight; ++y) {
            out.StartArray(true);
            for (unsigned int x = 0; x < ai.mWidth; ++x) {
                const aiTexel& tx = ai.pcData[y*ai.mWidth + x];
                out.StartArray(true);
                out.Element(static_cast<unsigned int>(tx.r));
                out.Element(static_cast<unsigned int>(tx.g));
                out.Element(static_cast<unsigned int>(tx.b));
                out.Element(static_cast<unsigned int>(tx.a));
                out.EndArray();
            }
            out.EndArray();
        }
        out.EndArray();
    }

    out.EndObj();
}